

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

ssize_t mqtt_unpack_pubxxx_response(mqtt_response *mqtt_response,uint8_t *buf)

{
  uint16_t uVar1;
  uint16_t packet_id;
  uint8_t *start;
  uint8_t *buf_local;
  mqtt_response *mqtt_response_local;
  
  if ((mqtt_response->fixed_header).remaining_length == 2) {
    uVar1 = __mqtt_unpack_uint16(buf);
    mqtt_response_local = (mqtt_response *)0x2;
    if ((mqtt_response->fixed_header).control_type == MQTT_CONTROL_PUBACK) {
      (mqtt_response->decoded).suback.packet_id = uVar1;
    }
    else if ((mqtt_response->fixed_header).control_type == MQTT_CONTROL_PUBREC) {
      (mqtt_response->decoded).suback.packet_id = uVar1;
    }
    else if ((mqtt_response->fixed_header).control_type == MQTT_CONTROL_PUBREL) {
      (mqtt_response->decoded).suback.packet_id = uVar1;
    }
    else {
      (mqtt_response->decoded).suback.packet_id = uVar1;
    }
  }
  else {
    mqtt_response_local = (mqtt_response *)0xffffffff8000000c;
  }
  return (ssize_t)mqtt_response_local;
}

Assistant:

ssize_t mqtt_unpack_pubxxx_response(struct mqtt_response *mqtt_response, const uint8_t *buf) 
{
    const uint8_t *const start = buf;
    uint16_t packet_id;

    /* assert remaining length is correct */
    if (mqtt_response->fixed_header.remaining_length != 2) {
        return MQTT_ERROR_MALFORMED_RESPONSE;
    }

    /* parse packet_id */
    packet_id = __mqtt_unpack_uint16(buf);
    buf += 2;

    if (mqtt_response->fixed_header.control_type == MQTT_CONTROL_PUBACK) {
        mqtt_response->decoded.puback.packet_id = packet_id;
    } else if (mqtt_response->fixed_header.control_type == MQTT_CONTROL_PUBREC) {
        mqtt_response->decoded.pubrec.packet_id = packet_id;
    } else if (mqtt_response->fixed_header.control_type == MQTT_CONTROL_PUBREL) {
        mqtt_response->decoded.pubrel.packet_id = packet_id;
    } else {
        mqtt_response->decoded.pubcomp.packet_id = packet_id;
    }

    return buf - start;
}